

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O0

int MpiGetPriority(CP_Services Svcs,void *CP_Stream,_SstParams *Params)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  int Provided;
  int IsInitialized;
  int ReturnValue;
  char *ReasonMsg;
  int local_2c;
  int local_28;
  int local_24;
  char *local_20;
  undefined8 local_10;
  undefined8 *local_8;
  
  local_20 = (char *)0x0;
  local_24 = 10;
  local_28 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  MPI_Initialized(&local_28);
  if (local_28 == 0) {
    local_20 = strdup("MPI_Initialized() failed");
    local_24 = -1;
  }
  else {
    local_2c = 0;
    MPI_Query_thread(&local_2c);
    if (local_2c == 3) {
      local_20 = strdup("Heuristics determined poor compatibility");
      local_24 = 0;
    }
    else {
      local_20 = strdup("MPI_THREAD_MULTIPLE not supported by MPI");
      local_24 = -1;
    }
  }
  (*(code *)*local_8)(local_10,2,"mpi_dp priority=%d since: %s.",local_24,local_20);
  free(local_20);
  return local_24;
}

Assistant:

static int MpiGetPriority(CP_Services Svcs, void *CP_Stream, struct _SstParams *Params)
{
    char *ReasonMsg = NULL;
    int ReturnValue = 10;
    int IsInitialized = 0;
    MPI_Initialized(&IsInitialized);
    if (IsInitialized)
    {
        int Provided = 0;
        MPI_Query_thread(&Provided);
        if (Provided == MPI_THREAD_MULTIPLE)
        {
#if defined(ADIOS2_SST_HAVE_MPI_DP_HEURISTICS_PASSED)
            ReasonMsg = strdup("Heuristics determined good compatibility");
            ReturnValue = 10;
#else
            ReasonMsg = strdup("Heuristics determined poor compatibility");
            ReturnValue = 0;
#endif
        }
        else
        {
            ReasonMsg = strdup("MPI_THREAD_MULTIPLE not supported by MPI");
            ReturnValue = -1;
        }
    }
    else
    {
        ReasonMsg = strdup("MPI_Initialized() failed");
        ReturnValue = -1;
    }

    Svcs->verbose(CP_Stream, DPSummaryVerbose, "mpi_dp priority=%d since: %s.", ReturnValue,
                  ReasonMsg);

    free(ReasonMsg);

    return ReturnValue;
}